

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall
flow::lang::LiteralExpr<flow::util::IPAddress>::LiteralExpr
          (LiteralExpr<flow::util::IPAddress> *this)

{
  SourceLocation local_88;
  IPAddress local_4c;
  
  local_4c.family_ = V4;
  local_4c.cstr_[0] = '\0';
  local_4c.buf_[0] = '\0';
  local_4c.buf_[1] = '\0';
  local_4c.buf_[2] = '\0';
  local_4c.buf_[3] = '\0';
  local_4c.buf_[4] = '\0';
  local_4c.buf_[5] = '\0';
  local_4c.buf_[6] = '\0';
  local_4c.buf_[7] = '\0';
  local_4c.buf_[8] = '\0';
  local_4c.buf_[9] = '\0';
  local_4c.buf_[10] = '\0';
  local_4c.buf_[0xb] = '\0';
  local_4c.buf_[0xc] = '\0';
  local_4c.buf_[0xd] = '\0';
  local_4c.buf_[0xe] = '\0';
  local_4c.buf_[0xf] = '\0';
  local_88.filename._M_dataplus._M_p = (pointer)&local_88.filename.field_2;
  local_88.filename._M_string_length = 0;
  local_88.filename.field_2._M_local_buf[0] = '\0';
  local_88.begin.line = 1;
  local_88.begin.column = 1;
  local_88.begin.offset = 0;
  local_88.end.line = 1;
  local_88.end.column = 1;
  local_88.end.offset = 0;
  LiteralExpr(this,&local_4c,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

LiteralExpr() : LiteralExpr(T(), SourceLocation()) {}